

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

char * __thiscall
icu_63::CollationLocaleListEnumeration::next
          (CollationLocaleListEnumeration *this,int32_t *resultLength,UErrorCode *param_2)

{
  int iVar1;
  Locale *pLVar2;
  size_t sVar3;
  char *local_28;
  char *result;
  UErrorCode *param_2_local;
  int32_t *resultLength_local;
  CollationLocaleListEnumeration *this_local;
  
  pLVar2 = ::availableLocaleList;
  if (*(int *)&(this->super_StringEnumeration).field_0x74 < ::availableLocaleListCount) {
    iVar1 = *(int *)&(this->super_StringEnumeration).field_0x74;
    *(int *)&(this->super_StringEnumeration).field_0x74 = iVar1 + 1;
    local_28 = Locale::getName(pLVar2 + iVar1);
    if (resultLength != (int32_t *)0x0) {
      sVar3 = strlen(local_28);
      *resultLength = (int32_t)sVar3;
    }
  }
  else {
    if (resultLength != (int32_t *)0x0) {
      *resultLength = 0;
    }
    local_28 = (char *)0x0;
  }
  return local_28;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& /*status*/) {
        const char* result;
        if(index < availableLocaleListCount) {
            result = availableLocaleList[index++].getName();
            if(resultLength != NULL) {
                *resultLength = (int32_t)uprv_strlen(result);
            }
        } else {
            if(resultLength != NULL) {
                *resultLength = 0;
            }
            result = NULL;
        }
        return result;
    }